

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O2

void do_quiet_movement(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  CClass *this;
  char *txt;
  long lVar6;
  AFFECT_DATA af;
  
  iVar3 = get_skill(ch,(int)gsn_quiet_movement);
  if (iVar3 != 0) {
    sVar1 = ch->level;
    lVar6 = (long)gsn_quiet_movement;
    this = char_data::Class(ch);
    iVar4 = CClass::GetIndex(this);
    if (*(short *)(lVar6 * 0x60 + 0x4ab788 + (long)iVar4 * 2) <= sVar1) {
      bVar2 = is_affected(ch,(int)gsn_quiet_movement);
      if (bVar2) {
        txt = "You are already attempting to move silently through the wilderness.\n\r";
      }
      else {
        uVar5 = *(int *)&ch->in_room->sector_type - 3;
        if ((ushort)uVar5 < 3) {
          send_to_char(&DAT_003d7ac8 + *(int *)(&DAT_003d7ac8 + (ulong)(uVar5 & 0xffff) * 4),ch);
          iVar4 = number_percent();
          if (iVar3 < iVar4) {
            check_improve(ch,(int)gsn_quiet_movement,false,1);
            return;
          }
          check_improve(ch,(int)gsn_quiet_movement,true,1);
          init_affect(&af);
          af.where = 0;
          af.type = gsn_quiet_movement;
          af.aftype = 1;
          af.location = 0;
          af.modifier = 0;
          af.level = ch->level;
          af.duration = af.level;
          affect_to_char(ch,&af);
          return;
        }
        txt = "You aren\'t in the right kind of wilderness to move quietly.\n\r";
      }
      goto LAB_002f54ef;
    }
  }
  txt = "You don\'t know how to move with silent stealth through the wilderness.\n\r";
LAB_002f54ef:
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_quiet_movement(CHAR_DATA *ch, char *argument)
{
	AFFECT_DATA af;
	int chance;

	chance = get_skill(ch, gsn_quiet_movement);

	if (chance == 0 || ch->level < skill_table[gsn_quiet_movement].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("You don't know how to move with silent stealth through the wilderness.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_quiet_movement))
	{
		send_to_char("You are already attempting to move silently through the wilderness.\n\r", ch);
		return;
	}

	if (ch->in_room->sector_type == SECT_FOREST)
	{
		send_to_char("You attempt to move quietly through the forest.\n\r", ch);
	}
	else if (ch->in_room->sector_type == SECT_MOUNTAIN)
	{
		send_to_char("You attempt to move quietly through the mountains.\n\r", ch);
	}
	else if (ch->in_room->sector_type == SECT_HILLS)
	{
		send_to_char("You attempt to move quietly through the hills.\n\r", ch);
	}
	else
	{
		send_to_char("You aren't in the right kind of wilderness to move quietly.\n\r", ch);
		return;
	}

	if (number_percent() > chance)
	{
		check_improve(ch, gsn_quiet_movement, false, 1);
		return;
	}

	check_improve(ch, gsn_quiet_movement, true, 1);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = gsn_quiet_movement;
	af.aftype = AFT_SKILL;
	af.location = 0;
	af.modifier = 0;
	af.duration = ch->level;
	af.level = ch->level;
	affect_to_char(ch, &af);
}